

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::ClassId(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_169;
  string local_168;
  TPZFrontNonSym<std::complex<double>_> local_148;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"TPZFrontStructMatrix",&local_169);
  uVar1 = Hash(&local_168);
  iVar2 = TPZStructMatrixT<std::complex<double>_>::ClassId
                    ((TPZStructMatrixT<std::complex<double>_> *)this);
  TPZFrontNonSym<std::complex<double>_>::TPZFrontNonSym(&local_148);
  iVar3 = TPZFrontNonSym<std::complex<double>_>::ClassId(&local_148);
  iVar4 = TPZStructMatrixOR<std::complex<double>_>::ClassId
                    ((TPZStructMatrixOR<std::complex<double>_> *)&this->field_0xa0);
  TPZFrontNonSym<std::complex<double>_>::~TPZFrontNonSym(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontStructMatrix<TFront,TVar,TPar>::ClassId() const{
    return Hash("TPZFrontStructMatrix") ^
        (TPZStructMatrixT<TVar>::ClassId()<< 1 ) ^
        TFront().ClassId() << 2 ^
        TPar::ClassId() << 3;
}